

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCuFunc.cpp
# Opt level: O1

void __thiscall NaCustomFunc::PrintLog(NaCustomFunc *this,char *szIndent)

{
  NaVector *this_00;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint i;
  char *pcVar4;
  
  iVar1 = (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[0xd])();
  if ((char)iVar1 == '\0') {
    pcVar4 = "";
    if (szIndent == (char *)0x0) {
      szIndent = "";
    }
    pcVar3 = NaConfigPart::GetInstance(&this->super_NaConfigPart);
    if (pcVar3 != (char *)0x0) {
      pcVar4 = NaConfigPart::GetInstance(&this->super_NaConfigPart);
    }
    i = 0;
    NaPrintLog("%sCustom function %s:\n",szIndent,pcVar4);
    NaPrintLog("%s  file    %s\n",szIndent,this->szFile);
    pcVar4 = "(nil)";
    if (this->szOptions != (char *)0x0) {
      pcVar4 = this->szOptions;
    }
    NaPrintLog("%s  options %s\n",szIndent,pcVar4);
    NaPrintLog("%s  initial");
    this_00 = &this->vInitial;
    uVar2 = NaVector::dim(this_00);
    if (uVar2 != 0) {
      do {
        NaVector::operator()(this_00,i);
        NaPrintLog(" %g");
        i = i + 1;
        uVar2 = NaVector::dim(this_00);
      } while (i < uVar2);
    }
    NaPrintLog("\n");
    NaPrintLog("%s  shared object     %p\n",this->so);
    NaPrintLog("%s  external function %p\n",this->exfunc);
    return;
  }
  return;
}

Assistant:

void
NaCustomFunc::PrintLog (const char* szIndent) const
{
  if(Empty())
    return;

  const char	*indent = (NULL == szIndent)? "": szIndent;
  NaPrintLog("%sCustom function %s:\n", indent,
	     (NULL == GetInstance())? "": GetInstance());
  NaPrintLog("%s  file    %s\n", indent, szFile);
  NaPrintLog("%s  options %s\n", indent, NULL==szOptions?"(nil)":szOptions);
  NaPrintLog("%s  initial");

  unsigned	i;
  for(i = 0; i < vInitial.dim(); ++i){
    NaPrintLog(" %g", vInitial(i));
  }
  NaPrintLog("\n");

  NaPrintLog("%s  shared object     %p\n", so);
  NaPrintLog("%s  external function %p\n", exfunc);
}